

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

void free_D_Scope(D_Scope *st,int force)

{
  D_Scope *pDVar1;
  D_SymHash *__ptr;
  D_Sym *pDVar2;
  D_Scope *st_00;
  D_Sym *pDVar3;
  uint uVar4;
  D_Sym **__ptr_00;
  ulong uVar5;
  
  st_00 = st->down;
  while (st_00 != (D_Scope *)0x0) {
    pDVar1 = st_00->down_next;
    free_D_Scope(st_00,0);
    st->down = pDVar1;
    st_00 = pDVar1;
  }
  if ((force == 0) &&
     ((undefined1  [80])((undefined1  [80])*st & (undefined1  [80])0x4) != (undefined1  [80])0x0)) {
    return;
  }
  __ptr = st->hash;
  if (__ptr == (D_SymHash *)0x0) {
    pDVar3 = st->ll;
    while (pDVar3 != (D_Sym *)0x0) {
      pDVar2 = pDVar3->next;
      free(pDVar3);
      st->ll = pDVar2;
      pDVar3 = pDVar2;
    }
  }
  else {
    uVar4 = (__ptr->syms).n;
    __ptr_00 = (__ptr->syms).v;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        pDVar3 = __ptr_00[uVar5];
        if (pDVar3 != (D_Sym *)0x0) {
          do {
            pDVar2 = pDVar3->next;
            free(pDVar3);
            (__ptr->syms).v[uVar5] = pDVar2;
            __ptr_00 = (__ptr->syms).v;
            pDVar3 = __ptr_00[uVar5];
          } while (pDVar3 != (D_Sym *)0x0);
          uVar4 = (__ptr->syms).n;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
    }
    free(__ptr_00);
    free(__ptr);
  }
  pDVar3 = st->updates;
  while (pDVar3 != (D_Sym *)0x0) {
    pDVar2 = pDVar3->next;
    free(pDVar3);
    st->updates = pDVar2;
    pDVar3 = pDVar2;
  }
  free(st);
  return;
}

Assistant:

void free_D_Scope(D_Scope *st, int force) {
  D_Scope *s;
  D_Sym *sym;
  for (; st->down; st->down = s) {
    s = st->down->down_next;
    free_D_Scope(st->down, 0);
  }
  if (st->owned_by_user && !force) return;
  if (st->hash)
    free_D_SymHash(st->hash);
  else
    for (; st->ll; st->ll = sym) {
      sym = st->ll->next;
      free_D_Sym(st->ll);
    }
  for (; st->updates; st->updates = sym) {
    sym = st->updates->next;
    free_D_Sym(st->updates);
  }
  FREE(st);
}